

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedCapacityPriorityQueue.h
# Opt level: O0

bool __thiscall
FixedCapacityPriorityQueue<std::pair<double,_unsigned_int>,_Problem_CGBG_FF::diPairComp>::insert
          (FixedCapacityPriorityQueue<std::pair<double,_unsigned_int>,_Problem_CGBG_FF::diPairComp>
           *this,pair<double,_unsigned_int> *a,pair<double,_unsigned_int> *overflown_T)

{
  const_iterator __position;
  bool bVar1;
  size_type sVar2;
  reference a_00;
  pair<double,_unsigned_int> *in_RDX;
  diPair *in_RSI;
  long in_RDI;
  diPairComp theLessOp_1;
  bool not_positioned;
  iterator last;
  iterator it;
  diPairComp theLessOp;
  pair<double,_unsigned_int> *last_in_queue;
  bool skip_insert;
  bool overflow;
  list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
  *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar3;
  _List_const_iterator<std::pair<double,_unsigned_int>_> in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  byte bVar4;
  _Self local_40;
  _Self local_38;
  diPairComp local_29;
  type local_28;
  byte local_1a;
  byte local_19;
  pair<double,_unsigned_int> *local_18;
  diPair *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = std::__cxx11::
          list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>::
          size((list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
                *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  local_19 = sVar2 == *(size_type *)(in_RDI + 0x18);
  local_1a = 0;
  if ((bool)local_19) {
    local_28 = std::__cxx11::
               list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
               ::back((list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar1 = Problem_CGBG_FF::diPairComp::operator()(&local_29,local_28,local_10);
    if (bVar1) {
      std::pair<double,_unsigned_int>::operator=(local_18,local_28);
      std::__cxx11::
      list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>::
      pop_back((list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
                *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    }
    else {
      std::pair<double,_unsigned_int>::operator=(local_18,local_10);
      local_1a = 1;
    }
  }
  if ((local_1a & 1) == 0) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>::
         begin(in_stack_ffffffffffffff88);
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>::
         end(in_stack_ffffffffffffff88);
    bVar4 = 1;
    while( true ) {
      bVar1 = std::operator!=(&local_38,&local_40);
      bVar3 = bVar4;
      if (!bVar1) {
        bVar3 = 0;
      }
      if ((bVar3 & 1) == 0) break;
      a_00 = std::_List_iterator<std::pair<double,_unsigned_int>_>::operator*
                       ((_List_iterator<std::pair<double,_unsigned_int>_> *)0x8f1a52);
      bVar1 = Problem_CGBG_FF::diPairComp::operator()
                        ((diPairComp *)&stack0xffffffffffffffbe,a_00,local_10);
      if (bVar1) {
        bVar4 = 0;
      }
      else {
        in_stack_ffffffffffffffb0 =
             std::_List_iterator<std::pair<double,_unsigned_int>_>::operator++(&local_38,0);
      }
    }
    std::_List_const_iterator<std::pair<double,_unsigned_int>_>::_List_const_iterator
              ((_List_const_iterator<std::pair<double,_unsigned_int>_> *)&stack0xffffffffffffffa8,
               &local_38);
    __position._M_node._7_1_ = bVar4;
    __position._M_node._0_7_ = in_stack_ffffffffffffffb8;
    std::__cxx11::
    list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>::insert
              ((list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
                *)in_stack_ffffffffffffffb0._M_node,__position,
               (value_type *)in_stack_ffffffffffffffa8._M_node);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool FixedCapacityPriorityQueue<T,_Compare>::insert( T& a, T& overflown_T )
{
    bool overflow = ( _m_l.size() == _m_capacity);
    bool skip_insert = false;

    if(overflow) //check if we need to make space at the end
    {
        // overflown_Tp is the T* to which overflown_Tpp points
        // we set the former to point to the overflown element.
        //T* & overflown_Tp = *overflown_Tpp;

        T& last_in_queue = _m_l.back();
        //std::less< T > theLessOp;
        _Compare theLessOp;
        if( theLessOp( last_in_queue,  a) )
        //if( last_in_queue <  a ) //doesn't work automatically...
        {
            //This does not work with (or need) pointers, 
            //this simply points to last position in queue !!!
            //overflown_Tp = &last_in_queue;             
            
            //rather copy the value of the stuff we will throw out!
            overflown_T = last_in_queue; 
            _m_l.pop_back();
        }
        else
        {
            overflown_T = a;
            skip_insert = true;
        }
    }

    if(!skip_insert)
    {
        //insert a at the appropriate place
        typename std::list<T>::iterator it = _m_l.begin();
        typename std::list<T>::iterator last = _m_l.end();
        bool not_positioned = true; //so long as it does not point to the correct pos.
        //std::less< T > theLessOp;
        _Compare theLessOp;
        while(it != last && not_positioned)
        {
            if( theLessOp( *it, a ) )
                not_positioned = false;
            else
                it++;
        }
        _m_l.insert( it, a);
    }
#if 0 && DEBUG_FCPQ
    std::cout << "----AFTER POP AND INSERT\nthe overflown_Tp=" <<overflown_Tp << ", which means it points to..." <<std::endl ;
    if(overflown_Tp != NULL)
    {
        T& the_overflown_T = (*overflown_Tp);
        std::string typestr = " JPPVValPair* ";
        std::cout << "the_overflown_T [T="<< typestr <<
            "]=" << the_overflown_T << ", which points to..."<<std::endl;

        if(the_overflown_T != NULL)
            std::cout<< (*the_overflown_T).SoftPrintBrief() << std::endl;
        else
            std::cout << "nothing" <<std::endl;
    }
    else
        std::cout << " nothing." << std::endl;
    
    std::cout << "----" <<std::endl ;
#endif
    
    return(overflow);
}